

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
glslang::TType::deepCopy
          (TType *this,TType *copyOf,
          TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
          *copiedMap)

{
  anon_union_8_2_8ac53c11_for_TType_13 aVar1;
  bool bVar2;
  uint uVar3;
  TSpirvDecorate *pTVar4;
  TSpirvType *this_00;
  TArraySizes *pTVar5;
  TTypeParameters *this_01;
  pointer ppVar6;
  TVector<glslang::TTypeLoc> *this_02;
  anon_union_8_2_8ac53c11_for_TType_13 *paVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  TType *this_03;
  char *pcVar11;
  TString *pTVar12;
  _Self *__y;
  size_t __n;
  undefined1 local_58 [8];
  TTypeLoc typeLoc;
  iterator iStack_30;
  uint i;
  _Self local_28;
  iterator prevCopy;
  TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
  *copiedMap_local;
  TType *copyOf_local;
  TType *this_local;
  
  pTVar4 = (TSpirvDecorate *)copyOf;
  prevCopy._M_node = (_Base_ptr)copiedMap;
  shallowCopy(this,copyOf);
  if ((copyOf->qualifier).spirvDecorate != (TSpirvDecorate *)0x0) {
    pTVar4 = (TSpirvDecorate *)TSpirvDecorate::operator_new((TSpirvDecorate *)0xa8,(size_t)pTVar4);
    TSpirvDecorate::TSpirvDecorate(pTVar4);
    (this->qualifier).spirvDecorate = pTVar4;
    pTVar4 = (copyOf->qualifier).spirvDecorate;
    TSpirvDecorate::operator=((this->qualifier).spirvDecorate,pTVar4);
  }
  if (copyOf->spirvType != (TSpirvType *)0x0) {
    this_00 = (TSpirvType *)TSpirvType::operator_new((TSpirvType *)0x50,(size_t)pTVar4);
    TSpirvType::TSpirvType(this_00);
    this->spirvType = this_00;
    pTVar4 = (TSpirvDecorate *)copyOf->spirvType;
    TSpirvType::operator=(this->spirvType,(TSpirvType *)pTVar4);
  }
  if (copyOf->arraySizes != (TArraySizes *)0x0) {
    pTVar5 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)pTVar4);
    TArraySizes::TArraySizes(pTVar5);
    this->arraySizes = pTVar5;
    pTVar4 = (TSpirvDecorate *)copyOf->arraySizes;
    TArraySizes::operator=(this->arraySizes,(TArraySizes *)pTVar4);
  }
  if (copyOf->typeParameters != (TTypeParameters *)0x0) {
    this_01 = (TTypeParameters *)
              TTypeParameters::operator_new((TTypeParameters *)0x18,(size_t)pTVar4);
    TTypeParameters::TTypeParameters(this_01);
    this->typeParameters = this_01;
    pTVar5 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)pTVar4);
    TArraySizes::TArraySizes(pTVar5);
    this->typeParameters->arraySizes = pTVar5;
    TArraySizes::operator=(this->typeParameters->arraySizes,copyOf->typeParameters->arraySizes);
    if (copyOf->typeParameters->spirvType != (TSpirvType *)0x0) {
      TSpirvType::operator=(this->typeParameters->spirvType,copyOf->typeParameters->spirvType);
    }
    this->typeParameters->basicType = *(TBasicType *)&copyOf->field_0x8 & 0xff;
  }
  uVar3 = (*copyOf->_vptr_TType[0x25])();
  if (((uVar3 & 1) != 0) && ((copyOf->field_13).structure != (TTypeList *)0x0)) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
         ::find(prevCopy._M_node,&(copyOf->field_13).structure);
    iStack_30 = std::
                map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                ::end(prevCopy._M_node);
    __y = &stack0xffffffffffffffd0;
    bVar2 = std::operator!=(&local_28,__y);
    if (bVar2) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>
               ::operator->(&local_28);
      this->field_13 = (anon_union_8_2_8ac53c11_for_TType_13)ppVar6->second;
    }
    else {
      this_02 = (TVector<glslang::TTypeLoc> *)
                TVector<glslang::TTypeLoc>::operator_new
                          ((TVector<glslang::TTypeLoc> *)0x20,(size_t)__y);
      TVector<glslang::TTypeLoc>::TVector(this_02);
      (this->field_13).structure = this_02;
      aVar1 = this->field_13;
      paVar7 = (anon_union_8_2_8ac53c11_for_TType_13 *)
               std::
               map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
               ::operator[]((map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                             *)prevCopy._M_node,&(copyOf->field_13).structure);
      *paVar7 = aVar1;
      for (typeLoc.loc._20_4_ = 0; uVar8 = (ulong)(uint)typeLoc.loc._20_4_,
          sVar9 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (&((copyOf->field_13).structure)->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ), uVar8 < sVar9; typeLoc.loc._20_4_ = typeLoc.loc._20_4_ + 1) {
        __n = (size_t)(uint)typeLoc.loc._20_4_;
        pvVar10 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                  operator[](&((copyOf->field_13).structure)->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ,__n);
        typeLoc.type = (TType *)(pvVar10->loc).name;
        typeLoc.loc.name = *(TString **)&(pvVar10->loc).string;
        typeLoc.loc.string = (pvVar10->loc).column;
        typeLoc.loc.line = *(int *)&(pvVar10->loc).field_0x14;
        this_03 = (TType *)operator_new((TType *)0x98,__n);
        TType(this_03,EbtVoid,EvqTemporary,1,0,0,false);
        local_58 = (undefined1  [8])this_03;
        pvVar10 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                  operator[](&((copyOf->field_13).structure)->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ,(ulong)(uint)typeLoc.loc._20_4_);
        deepCopy(this_03,pvVar10->type,
                 (TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
                  *)prevCopy._M_node);
        std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                  (&((this->field_13).structure)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,
                   (value_type *)local_58);
      }
    }
  }
  if (copyOf->fieldName != (TString *)0x0) {
    pcVar11 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                        (copyOf->fieldName);
    pTVar12 = NewPoolTString_abi_cxx11_(pcVar11);
    this->fieldName = pTVar12;
  }
  if (copyOf->typeName != (TString *)0x0) {
    pcVar11 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                        (copyOf->typeName);
    pTVar12 = NewPoolTString_abi_cxx11_(pcVar11);
    this->typeName = pTVar12;
  }
  return;
}

Assistant:

void deepCopy(const TType& copyOf, TMap<TTypeList*,TTypeList*>& copiedMap)
    {
        shallowCopy(copyOf);

        // GL_EXT_spirv_intrinsics
        if (copyOf.qualifier.spirvDecorate) {
            qualifier.spirvDecorate = new TSpirvDecorate;
            *qualifier.spirvDecorate = *copyOf.qualifier.spirvDecorate;
        }

        if (copyOf.spirvType) {
            spirvType = new TSpirvType;
            *spirvType = *copyOf.spirvType;
        }

        if (copyOf.arraySizes) {
            arraySizes = new TArraySizes;
            *arraySizes = *copyOf.arraySizes;
        }

        if (copyOf.typeParameters) {
            typeParameters = new TTypeParameters;
            typeParameters->arraySizes = new TArraySizes;
            *typeParameters->arraySizes = *copyOf.typeParameters->arraySizes;
            if (copyOf.typeParameters->spirvType) {
                *typeParameters->spirvType = *copyOf.typeParameters->spirvType;
            }
            typeParameters->basicType = copyOf.basicType;
        }

        if (copyOf.isStruct() && copyOf.structure) {
            auto prevCopy = copiedMap.find(copyOf.structure);
            if (prevCopy != copiedMap.end())
                structure = prevCopy->second;
            else {
                structure = new TTypeList;
                copiedMap[copyOf.structure] = structure;
                for (unsigned int i = 0; i < copyOf.structure->size(); ++i) {
                    TTypeLoc typeLoc;
                    typeLoc.loc = (*copyOf.structure)[i].loc;
                    typeLoc.type = new TType();
                    typeLoc.type->deepCopy(*(*copyOf.structure)[i].type, copiedMap);
                    structure->push_back(typeLoc);
                }
            }
        }

        if (copyOf.fieldName)
            fieldName = NewPoolTString(copyOf.fieldName->c_str());
        if (copyOf.typeName)
            typeName = NewPoolTString(copyOf.typeName->c_str());
    }